

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O2

FT_Error cf2_getT1SeacComponent(PS_Decoder *decoder,FT_UInt glyph_index,CF2_Buffer buf)

{
  FT_Face pFVar1;
  FT_Incremental_InterfaceRec *pFVar2;
  FT_Byte *pFVar3;
  FT_Error FVar4;
  FT_Data *pFVar5;
  FT_Data local_20;
  
  pFVar1 = (decoder->builder).face;
  pFVar2 = pFVar1->internal->incremental_interface;
  if (pFVar2 == (FT_Incremental_InterfaceRec *)0x0) {
    pFVar5 = (FT_Data *)(&(pFVar1[2].size)->face + glyph_index);
    local_20.length = *(uint *)((long)&(pFVar1[2].charmap)->face + (ulong)glyph_index * 4);
  }
  else {
    pFVar5 = &local_20;
    FVar4 = (*pFVar2->funcs->get_glyph_data)(pFVar2->object,glyph_index,pFVar5);
    if (FVar4 != 0) {
      return FVar4;
    }
  }
  pFVar3 = pFVar5->pointer;
  buf->error = (FT_Error *)0x0;
  buf->ptr = pFVar3;
  buf->start = pFVar3;
  buf->end = pFVar3 + local_20.length;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getT1SeacComponent( PS_Decoder*  decoder,
                          FT_UInt      glyph_index,
                          CF2_Buffer   buf )
  {
    FT_Data   glyph_data;
    FT_Error  error = FT_Err_Ok;
    T1_Face   face  = (T1_Face)decoder->builder.face;
    T1_Font   type1 = &face->type1;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec  *inc =
      face->root.internal->incremental_interface;


    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( inc )
      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, &glyph_data );
    else
#endif
    /* For ordinary fonts get the character data stored in the face record. */
    {
      glyph_data.pointer = type1->charstrings[glyph_index];
      glyph_data.length  = type1->charstrings_len[glyph_index];
    }

    if ( !error )
    {
      FT_Byte*  charstring_base = (FT_Byte*)glyph_data.pointer;
      FT_ULong  charstring_len  = glyph_data.length;


      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( buf );
      buf->start =
      buf->ptr   = charstring_base;
      buf->end   = charstring_base + charstring_len;
    }

    return error;
  }